

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateInfoFree(HelicsFederateInfo fedInfo)

{
  if ((fedInfo != (HelicsFederateInfo)0x0) && (*(int *)((long)fedInfo + 0x48) == 0x6bfbbce1)) {
    *(undefined4 *)((long)fedInfo + 0x48) = 0;
    helics::FederateInfo::~FederateInfo((FederateInfo *)fedInfo);
    operator_delete(fedInfo,0x1a8);
    return;
  }
  return;
}

Assistant:

void helicsFederateInfoFree(HelicsFederateInfo fedInfo)
{
    auto* info = getFedInfo(fedInfo, nullptr);
    if (info == nullptr) {
        // fprintf(stderr, "The HelicsFederateInfo object is not valid\n");
        return;
    }
    info->uniqueKey = 0;
    delete info;
}